

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O0

void __thiscall
ArgWrapper<wchar_t>::ArgWrapper
          (ArgWrapper<wchar_t> *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *in_args)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  wchar_t **__p;
  reference this_00;
  wchar_t *pwVar4;
  type ppwVar5;
  size_t local_30;
  size_t index;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *in_args_local;
  ArgWrapper<wchar_t> *this_local;
  
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&this->m_args,in_args);
  sVar2 = std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::size(in_args);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2 + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __p = (wchar_t **)operator_new__(uVar3);
  std::unique_ptr<wchar_t_const*[],std::default_delete<wchar_t_const*[]>>::
  unique_ptr<wchar_t_const**,std::default_delete<wchar_t_const*[]>,void,bool>
            ((unique_ptr<wchar_t_const*[],std::default_delete<wchar_t_const*[]>> *)&this->m_argv,__p
            );
  local_30 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::size(&this->m_args);
    if (local_30 == sVar2) break;
    this_00 = std::
              vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ::operator[](&this->m_args,local_30);
    pwVar4 = std::__cxx11::
             basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::c_str
                       (this_00);
    ppwVar5 = std::unique_ptr<const_wchar_t_*[],_std::default_delete<const_wchar_t_*[]>_>::
              operator[](&this->m_argv,local_30);
    *ppwVar5 = pwVar4;
    local_30 = local_30 + 1;
  }
  sVar2 = std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::size(in_args);
  ppwVar5 = std::unique_ptr<const_wchar_t_*[],_std::default_delete<const_wchar_t_*[]>_>::operator[]
                      (&this->m_argv,sVar2);
  *ppwVar5 = (wchar_t *)0x0;
  return;
}

Assistant:

ArgWrapper(std::vector<std::basic_string<CharT>> in_args)
		: m_args{ in_args },
		m_argv{ new const CharT*[in_args.size() + 1] } {
		// Populate m_argv
		for (size_t index = 0; index != m_args.size(); ++index) {
			m_argv[index] = m_args[index].c_str();
		}
		m_argv[in_args.size()] = nullptr; // last arg is always nullptr
	}